

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

void __thiscall
google::protobuf::DescriptorBuilder::BuildMethod
          (DescriptorBuilder *this,MethodDescriptorProto *proto,ServiceDescriptor *parent,
          MethodDescriptor *result)

{
  Symbol symbol;
  string *psVar1;
  undefined1 *orig_options;
  undefined4 uStack_2c;
  
  psVar1 = DescriptorPool::Tables::AllocateString(this->tables_,(proto->name_).ptr_);
  *(string **)result = psVar1;
  *(ServiceDescriptor **)(result + 0x10) = parent;
  psVar1 = AllocateNameString(this,*(string **)(parent + 8),psVar1);
  *(string **)(result + 8) = psVar1;
  ValidateSymbolName(this,(proto->name_).ptr_,psVar1,&proto->super_Message);
  *(undefined8 *)(result + 0x48) = 0;
  *(undefined8 *)(result + 0x50) = 0;
  *(undefined8 *)(result + 0x38) = 0;
  *(undefined8 *)(result + 0x40) = 0;
  *(undefined8 *)(result + 0x28) = 0;
  *(undefined8 *)(result + 0x30) = 0;
  *(undefined8 *)(result + 0x18) = 0;
  *(undefined8 *)(result + 0x20) = 0;
  if (((proto->_has_bits_).has_bits_[0] & 8) == 0) {
    *(undefined8 *)(result + 0x58) = 0;
  }
  else {
    orig_options = (undefined1 *)proto->options_;
    if ((MethodOptions *)orig_options == (MethodOptions *)0x0) {
      orig_options = _MethodOptions_default_instance_;
    }
    AllocateOptions<google::protobuf::MethodDescriptor>(this,(OptionsType *)orig_options,result,4);
  }
  result[0x60] = (MethodDescriptor)proto->client_streaming_;
  result[0x61] = (MethodDescriptor)proto->server_streaming_;
  symbol._4_4_ = uStack_2c;
  symbol.type = 7;
  symbol.field_1.method_descriptor = result;
  AddSymbol(this,*(string **)(result + 8),parent,*(string **)result,&proto->super_Message,symbol);
  return;
}

Assistant:

void DescriptorBuilder::BuildMethod(const MethodDescriptorProto& proto,
                                    const ServiceDescriptor* parent,
                                    MethodDescriptor* result) {
  result->name_ = tables_->AllocateString(proto.name());
  result->service_ = parent;

  std::string* full_name =
      AllocateNameString(parent->full_name(), *result->name_);
  result->full_name_ = full_name;

  ValidateSymbolName(proto.name(), *full_name, proto);

  // These will be filled in when cross-linking.
  result->input_type_.Init();
  result->output_type_.Init();

  // Copy options.
  if (!proto.has_options()) {
    result->options_ = nullptr;  // Will set to default_instance later.
  } else {
    AllocateOptions(proto.options(), result,
                    MethodDescriptorProto::kOptionsFieldNumber);
  }

  result->client_streaming_ = proto.client_streaming();
  result->server_streaming_ = proto.server_streaming();

  AddSymbol(result->full_name(), parent, result->name(), proto, Symbol(result));
}